

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_option_f.c
# Opt level: O1

void unpack(char *dirname,char *option)

{
  wchar_t wVar1;
  
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_option_f.c"
                     ,L'$',dirname,L'ǭ');
  assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_option_f.c"
                  ,L'%',dirname);
  extract_reference_file("test_option_f.cpio");
  wVar1 = systemf("%s -i %s < test_option_f.cpio > copy-no-a.out 2>copy-no-a.err",testprog,option);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_option_f.c"
                      ,L'(',0,"0",(long)wVar1,"r",(void *)0x0);
  assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/cpio/test/test_option_f.c"
                  ,L')',"..");
  return;
}

Assistant:

static void
unpack(const char *dirname, const char *option)
{
	int r;

	assertMakeDir(dirname, 0755);
	assertChdir(dirname);
	extract_reference_file("test_option_f.cpio");
	r = systemf("%s -i %s < test_option_f.cpio > copy-no-a.out 2>copy-no-a.err", testprog, option);
	assertEqualInt(0, r);
	assertChdir("..");
}